

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,Cord *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  uint8_t *data;
  undefined4 extraout_var_00;
  Nullable<const_char_*> pcVar4;
  undefined4 extraout_var_01;
  LogMessage *this_00;
  _func_int **size_hint;
  byte bVar5;
  Span<char> SVar6;
  uint8_t *target;
  CordBuffer buffer;
  anon_union_16_2_39e9c77e_for_Rep_0 local_f0;
  CordOutputStream output_stream;
  CordBuffer local_a8;
  anon_union_16_2_39e9c77e_for_Rep_0 local_98;
  CordBuffer local_88;
  _func_int **local_78;
  EpsCopyOutputStream out;
  ulong v;
  
  iVar2 = (*this->_vptr_MessageLite[3])();
  v = CONCAT44(extraout_var,iVar2);
  sVar3 = absl::lts_20250127::Cord::InlineRep::size(&output->contents_);
  if ((v & 0xffffffff80000000) == 0) {
    absl::lts_20250127::Cord::GetAppendBuffer((Cord *)&buffer,(size_t)output,v);
    SVar6 = absl::lts_20250127::CordBuffer::available(&buffer);
    data = (uint8_t *)SVar6.ptr_;
    size_hint = (_func_int **)(sVar3 + v);
    target = data;
    if (SVar6.len_ < v) {
      sVar3 = absl::lts_20250127::CordBuffer::capacity(&buffer);
      absl::lts_20250127::CordBuffer::SetLength(&buffer,sVar3);
      local_98.as_tree.cordz_info = (output->contents_).data_.rep_.field_0.as_tree.cordz_info;
      local_98.as_tree.rep = (output->contents_).data_.rep_.field_0.as_tree.rep;
      (output->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      local_a8.rep_.field_0.long_rep.padding = buffer.rep_.field_0.long_rep.padding;
      buffer.rep_.field_0.short_rep.raw_size = '\x01';
      io::CordOutputStream::CordOutputStream
                (&output_stream,(Cord *)&local_98.as_tree,&local_a8,(size_t)size_hint);
      absl::lts_20250127::CordBuffer::~CordBuffer(&local_a8);
      absl::lts_20250127::Cord::~Cord((Cord *)&local_98.as_tree);
      io::EpsCopyOutputStream::EpsCopyOutputStream
                (&out,data,(int)SVar6.len_,&output_stream.super_ZeroCopyOutputStream,
                 (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1),&target);
      iVar2 = (*this->_vptr_MessageLite[5])(this,target,&out);
      target = (uint8_t *)CONCAT44(extraout_var_00,iVar2);
      io::EpsCopyOutputStream::Trim(&out,target);
      bVar1 = out.had_error_;
      if (out.had_error_ == false) {
        io::CordOutputStream::Consume((CordOutputStream *)&local_f0.as_tree);
        absl::lts_20250127::Cord::InlineRep::operator=
                  (&output->contents_,(InlineRep *)&local_f0.as_tree);
        absl::lts_20250127::Cord::~Cord((Cord *)&local_f0.as_tree);
        local_f0.as_tree.cordz_info = absl::lts_20250127::Cord::InlineRep::size(&output->contents_);
        local_78 = size_hint;
        pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                           ((unsigned_long *)local_f0.data,(unsigned_long *)&local_78,
                            "output->size() == total_size");
        if (pcVar4 != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_f0.as_tree,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                     ,0x2ba,pcVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_f0.as_tree);
        }
      }
      bVar5 = bVar1 ^ 1;
      io::CordOutputStream::~CordOutputStream(&output_stream);
    }
    else {
      out.end_ = data + (int)SVar6.len_;
      out.buffer_end_ = (uint8_t *)0x0;
      out.stream_ = (ZeroCopyOutputStream *)0x0;
      out.had_error_ = false;
      out.aliasing_enabled_ = false;
      out.is_serialization_deterministic_ =
           (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
      out.skip_check_consistency = false;
      iVar2 = (*this->_vptr_MessageLite[5])(this,data);
      output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
           (_func_int **)CONCAT44(extraout_var_01,iVar2);
      local_f0.as_tree.cordz_info = (cordz_info_t)(target + v);
      pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<void_const*,void_const*>
                         ((void **)&output_stream,(void **)&local_f0,
                          "static_cast<const void*>(res) == static_cast<const void*>(target + size)"
                         );
      if (pcVar4 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&output_stream,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2a7,pcVar4);
LAB_00cab47b:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&output_stream);
      }
      absl::lts_20250127::CordBuffer::IncreaseLengthBy(&buffer,v);
      local_88.rep_.field_0.long_rep.padding = buffer.rep_.field_0.long_rep.padding;
      buffer.rep_.field_0.short_rep.raw_size = '\x01';
      absl::lts_20250127::Cord::Append(output,&local_88);
      absl::lts_20250127::CordBuffer::~CordBuffer(&local_88);
      output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
           (_func_int **)absl::lts_20250127::Cord::InlineRep::size(&output->contents_);
      local_f0.as_tree.cordz_info = (cordz_info_t)size_hint;
      pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&output_stream,(unsigned_long *)local_f0.data,
                          "output->size() == total_size");
      if (pcVar4 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&output_stream,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2aa,pcVar4);
        goto LAB_00cab47b;
      }
      bVar5 = 1;
    }
    absl::lts_20250127::CordBuffer::~CordBuffer(&buffer);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&out,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x296);
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&out,(char (*) [40])"Exceeded maximum protobuf size of 2GB: "
                        );
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&out);
    bVar5 = 0;
  }
  return (bool)bVar5;
}

Assistant:

bool MessageLite::AppendPartialToString(absl::Cord* output) const {
  // For efficiency, we'd like to pass a size hint to CordOutputStream with
  // the exact total size expected.
  const size_t size = ByteSizeLong();
  const size_t total_size = size + output->size();
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }


  // Allocate a CordBuffer (which may utilize private capacity in 'output').
  absl::CordBuffer buffer = output->GetAppendBuffer(size);
  absl::Span<char> available = buffer.available();
  auto target = reinterpret_cast<uint8_t*>(available.data());
  if (available.size() >= size) {
    // Use EpsCopyOutputStream with full available capacity, as serialization
    // may in the future use the extra slop bytes if available.
    io::EpsCopyOutputStream out(
        target, static_cast<int>(available.size()),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    auto res = _InternalSerialize(target, &out);
    ABSL_DCHECK_EQ(static_cast<const void*>(res),
                   static_cast<const void*>(target + size));
    buffer.IncreaseLengthBy(size);
    output->Append(std::move(buffer));
    ABSL_DCHECK_EQ(output->size(), total_size);
    return true;
  }

  // Donate the buffer to the CordOutputStream with length := capacity.
  // This follows the eager `EpsCopyOutputStream` initialization logic.
  buffer.SetLength(buffer.capacity());
  io::CordOutputStream output_stream(std::move(*output), std::move(buffer),
                                     total_size);
  io::EpsCopyOutputStream out(
      target, static_cast<int>(available.size()), &output_stream,
      io::CodedOutputStream::IsDefaultSerializationDeterministic(), &target);
  target = _InternalSerialize(target, &out);
  out.Trim(target);
  if (out.HadError()) return false;
  *output = output_stream.Consume();
  ABSL_DCHECK_EQ(output->size(), total_size);
  return true;
}